

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_200625d::BlendA64MaskTestHBD_d16_DISABLED_Speed_Test::TestBody
          (BlendA64MaskTestHBD_d16_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  uint32_t uVar2;
  int i;
  long lVar3;
  int bsize;
  int block_size;
  
  this_00 = &(this->super_BlendA64MaskTestHBD_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
             .rng_;
  block_size = 0;
  do {
    (this->super_BlendA64MaskTestHBD_d16).bit_depth_ = 8;
    lVar3 = 0;
    do {
      do {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_BlendA64MaskTestHBD_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
        .dst_ref_[lVar3] =
             (unsigned_short)
             ((long)(ulong)(uVar2 >> 0x13 & 0xfff) %
             (long)(1 << ((byte)(this->super_BlendA64MaskTestHBD_d16).bit_depth_ & 0x1f)));
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_BlendA64MaskTestHBD_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
        .dst_tst_[lVar3] =
             (unsigned_short)
             ((long)(ulong)(uVar2 >> 0x13 & 0xfff) %
             (long)(1 << ((byte)(this->super_BlendA64MaskTestHBD_d16).bit_depth_ & 0x1f)));
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_BlendA64MaskTestHBD_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
        .src0_[lVar3] = (unsigned_short)(uVar2 >> 0xf);
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_BlendA64MaskTestHBD_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
        .src1_[lVar3] = (unsigned_short)(uVar2 >> 0xf);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x14000);
      lVar3 = 0xa0050;
      do {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x41);
        *(char *)((long)(this->super_BlendA64MaskTestHBD_d16).
                        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
                        .dst_ref_ + lVar3 + -0x38) = (char)uVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xb0050);
      BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
      ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
                 *)this,block_size,10000000);
      iVar1 = (this->super_BlendA64MaskTestHBD_d16).bit_depth_;
      (this->super_BlendA64MaskTestHBD_d16).bit_depth_ = iVar1 + 2;
      lVar3 = 0;
    } while (iVar1 < 0xb);
    block_size = block_size + 1;
  } while (block_size != 0x16);
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_.Rand12() % (1 << bit_depth_);
        dst_tst_[i] = rng_.Rand12() % (1 << bit_depth_);

        src0_[i] = rng_.Rand16();
        src1_[i] = rng_.Rand16();
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      RunTest(bsize, kRunTimes);
    }
  }
}